

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

double __thiscall
imrt::ApertureILS::improvementAperture
          (ApertureILS *this,int beamlet,Station *station,bool open_beamlet,double c_eval,Plan *P,
          bool best_improvement)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  ulong unaff_RBP;
  Plan *this_00;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  vector<int,_std::allocator<int>_> a_list;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&diff;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node._M_size = 0;
  a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  if ((int)CONCAT71(in_register_00000009,open_beamlet) == 0) {
    Station::getOpen((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa0,station,beamlet);
  }
  else {
    Station::getClosed((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa0,station,beamlet
                      );
  }
  this_00 = (Plan *)&stack0xffffffffffffffa0;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&a_list,this_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)this_00);
  if (a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      == a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    std::operator<<((ostream *)&std::cout,"[NOPT] ");
    dVar1 = c_eval;
  }
  else {
    iVar4 = rand();
    iVar8 = 0;
    uVar6 = (ulong)(long)iVar4 %
            (ulong)((long)a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2);
    bVar3 = true;
    local_48 = (_Base_ptr)0xbff0000000000000;
    p_Stack_40 = (_Base_ptr)0x0;
    while (bVar3) {
      if (open_beamlet) {
        dVar1 = openBeamlet((ApertureILS *)this_00,beamlet,
                            a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(int)uVar6],station,c_eval,P);
        uVar9 = SUB84(dVar1,0);
        uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
        uVar10 = extraout_XMM0_Dc;
        uVar12 = extraout_XMM0_Dd;
      }
      else {
        dVar1 = closeBeamlet((ApertureILS *)this_00,beamlet,0,
                             a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)uVar6],station,c_eval,P);
        uVar9 = SUB84(dVar1,0);
        uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
        uVar10 = extraout_XMM0_Dc_00;
        uVar12 = extraout_XMM0_Dd_00;
      }
      bVar2 = -(0.0 <= (double)local_48) &
              -((double)local_48 - (double)CONCAT44(uVar11,uVar9) <= 1e-05);
      if ((bVar2 & 1) == 0) {
        local_48 = (_Base_ptr)CONCAT44(uVar11,uVar9);
        p_Stack_40 = (_Base_ptr)CONCAT44(uVar12,uVar10);
        unaff_RBP = uVar6;
      }
      unaff_RBP = unaff_RBP & 0xffffffff;
      dVar1 = (double)CONCAT44(uVar11,uVar9);
      if (((bVar2 | best_improvement) & 1) == 0) goto LAB_00123cb6;
      Station::undoLast_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 &stack0xffffffffffffffa0,station);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_move_assign(&diff,(Plan *)&stack0xffffffffffffffa0);
      this_00 = (Plan *)&stack0xffffffffffffffa0;
      std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_clear((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               &stack0xffffffffffffffa0);
      if (diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl._M_node._M_size != 0) {
        this_00 = P;
        Plan::incremental_eval(P,station,&diff);
      }
      if ((bVar2 & 1) == 0) {
        iVar8 = 1;
      }
      else {
        iVar8 = iVar8 + 1;
      }
      uVar7 = (int)uVar6 + 1;
      uVar5 = (long)a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      uVar6 = 0;
      if (uVar5 != (long)(int)uVar7) {
        uVar6 = (ulong)uVar7;
      }
      bVar3 = (ulong)(long)iVar8 < uVar5;
    }
    if (open_beamlet) {
      dVar1 = openBeamlet((ApertureILS *)this_00,beamlet,
                          a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)unaff_RBP],station,c_eval,P);
      uVar10 = SUB84(dVar1,0);
      uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    else {
      dVar1 = closeBeamlet((ApertureILS *)this_00,beamlet,0,
                           a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(int)unaff_RBP],station,c_eval,P);
      uVar10 = SUB84(dVar1,0);
      uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    dVar1 = (double)CONCAT44(uVar12,uVar10);
  }
LAB_00123cb6:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&a_list.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
  ;
  return dVar1;
}

Assistant:

double ApertureILS::improvementAperture(int beamlet, Station& station, bool open_beamlet, 
                                             double c_eval, Plan& P, bool best_improvement) {
  double local_best=-1, aux_eval=0;
  list<pair<int, double> > diff;
  int a, local_a, i;
  bool flag=true; 
  vector<int> a_list;
  
  if (!open_beamlet) a_list = station.getOpen(beamlet);
  else a_list = station.getClosed(beamlet);
  
  if (a_list.size()<1) {
    cout << "[NOPT] ";
    //cout << endl << "Warning: not possible to make aperture change beamlet:" << beamlet <<endl;
    return(c_eval);
  }
  
  a = (int)rand() % a_list.size();
  i = 0;
  
  // Check every aperture 
  while(flag) {
    if (!open_beamlet) {
      aux_eval = closeBeamlet(beamlet, 0, a_list[a], station, c_eval, P); 
    } else {
      aux_eval = openBeamlet(beamlet, a_list[a], station, c_eval, P);
    } 
    
    // First improvement
    if (local_best < 0 || (local_best-aux_eval) >0.00001){
      local_best = aux_eval;
      local_a =a ;
      i=0; // to support best improvement
      if (!best_improvement)
        return(local_best);
    } 
    
    diff = station.undoLast();
    if (diff.size()>0)
      aux_eval = P.incremental_eval(station, diff);
    i++;
    a++;
    if (a==a_list.size()) a=0;
    if (i>=a_list.size()) flag=false;
  }
  
  // If no improvement was found, return the best solution found.
  if (!open_beamlet) {
    local_best = closeBeamlet(beamlet, 0, a_list[local_a], station, c_eval, P);
  } else{
    local_best = openBeamlet(beamlet, a_list[local_a], station, c_eval, P);
  }
  return(local_best);
  
}